

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_members_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_MembersTest_::
SimpleFunctions<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
::TestBody(SimpleFunctions<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_4UL,_phmap::NullMutex>_>
           *this)

{
  long lVar1;
  char *message;
  AssertHelper aAStack_4c8 [5];
  internal local_4a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  undefined8 uStack_490;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_488;
  
  lVar1 = 0x40;
  do {
    *(undefined8 *)((long)&aAStack_4c8[2].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_4c8[3].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_4c8[0].data_ + lVar1) = 0;
    *(undefined8 *)((long)&aAStack_4c8[1].data_ + lVar1) = 0;
    *(undefined8 *)(local_4a0 + lVar1) = 0;
    *(long *)((long)&local_498 + lVar1) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&uStack_490 + lVar1) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_488.sets_._M_elems[0].set_.ctrl_ + lVar1) = 0;
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x4c0);
  aAStack_4c8[4].data_ = (AssertHelperData *)0xffffffffffffffff;
  uStack_490._4_4_ = 0;
  aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6f95;
  testing::internal::CmpHelperGT<unsigned_long,int>
            (local_4a0,"TypeParam().max_size()","0",(unsigned_long *)(aAStack_4c8 + 4),
             (int *)((long)&uStack_490 + 4));
  aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6f9f;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::~parallel_hash_set(&local_488);
  if (local_4a0[0] == (internal)0x0) {
    aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6fb0;
    testing::Message::Message((Message *)&local_488);
    if (local_498 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_498->_M_dataplus)._M_p;
    }
    aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6fdf;
    testing::internal::AssertHelper::AssertHelper
              (aAStack_4c8 + 4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_members_test.h"
               ,0x43,message);
    aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6fec;
    testing::internal::AssertHelper::operator=(aAStack_4c8 + 4,(Message *)&local_488);
    aAStack_4c8[3].data_ = (AssertHelperData *)0x1a6ff4;
    testing::internal::AssertHelper::~AssertHelper(aAStack_4c8 + 4);
    if ((long *)local_488.sets_._M_elems[0].set_.ctrl_ != (long *)0x0) {
      aAStack_4c8[3].data_ = (AssertHelperData *)0x1a7004;
      (**(code **)(*(long *)local_488.sets_._M_elems[0].set_.ctrl_ + 8))();
    }
  }
  if (local_498 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    aAStack_4c8[3].data_ = (AssertHelperData *)0x1a7018;
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_498,local_498);
  }
  return;
}

Assistant:

TYPED_TEST_P(MembersTest, SimpleFunctions) {
  EXPECT_GT(TypeParam().max_size(), 0);
}